

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O0

Pla_Man_t * Pla_ReadPla(char *pFileName)

{
  int iVar1;
  uint uVar2;
  char *local_48;
  char *pLimit;
  char *pBuffer;
  int Type;
  int nCubes;
  int nOuts;
  int nIns;
  Vec_Str_t *vLits;
  Pla_Man_t *p;
  char *pFileName_local;
  
  p = (Pla_Man_t *)pFileName;
  pLimit = Pla_ReadFile(pFileName,&local_48);
  if (pLimit != (char *)0x0) {
    Pla_ReadPlaRemoveComments(pLimit,local_48);
    iVar1 = Pla_ReadPlaHeader(pLimit,local_48,&nCubes,&Type,(int *)((long)&pBuffer + 4),
                              (int *)&pBuffer);
    if (iVar1 != 0) {
      _nOuts = Pla_ReadPlaBody(pLimit,local_48,(Pla_File_t)pBuffer);
      iVar1 = Vec_StrSize(_nOuts);
      if (iVar1 % (nCubes + Type) == 0) {
        if (pBuffer._4_4_ == -1) {
          iVar1 = Vec_StrSize(_nOuts);
          pBuffer._4_4_ = iVar1 / (nCubes + Type);
        }
        vLits = (Vec_Str_t *)Pla_ManAlloc((char *)p,nCubes,Type,pBuffer._4_4_);
        ((Pla_Man_t *)vLits)->Type = (Pla_File_t)pBuffer;
        Pla_ReadAddBody((Pla_Man_t *)vLits,_nOuts);
        Vec_StrFree(_nOuts);
        if (pLimit != (char *)0x0) {
          free(pLimit);
        }
        return (Pla_Man_t *)vLits;
      }
      uVar2 = Vec_StrSize(_nOuts);
      printf("Literal count is incorrect (in = %d; out = %d; lit = %d).\n",(ulong)(uint)nCubes,
             (ulong)(uint)Type,(ulong)uVar2);
      Vec_StrFree(_nOuts);
    }
    if (pLimit != (char *)0x0) {
      free(pLimit);
    }
  }
  return (Pla_Man_t *)0x0;
}

Assistant:

Pla_Man_t * Pla_ReadPla( char * pFileName )
{   
    Pla_Man_t * p;
    Vec_Str_t * vLits;
    int nIns, nOuts, nCubes, Type;
    char * pBuffer, * pLimit;   
    pBuffer = Pla_ReadFile( pFileName, &pLimit );
    if ( pBuffer == NULL )
        return NULL;
    Pla_ReadPlaRemoveComments( pBuffer, pLimit );
    if ( Pla_ReadPlaHeader( pBuffer, pLimit, &nIns, &nOuts, &nCubes, &Type ) )
    {
        vLits = Pla_ReadPlaBody( pBuffer, pLimit, (Pla_File_t)Type );
        if ( Vec_StrSize(vLits) % (nIns + nOuts) == 0 )
        {
            if ( nCubes == -1 )
                nCubes = Vec_StrSize(vLits) / (nIns + nOuts);
            p = Pla_ManAlloc( pFileName, nIns, nOuts, nCubes );
            p->Type = (Pla_File_t)Type;
            Pla_ReadAddBody( p, vLits );
            Vec_StrFree( vLits );
            ABC_FREE( pBuffer );
            return p;
        }
        printf( "Literal count is incorrect (in = %d; out = %d; lit = %d).\n", nIns, nOuts, Vec_StrSize(vLits) );
        Vec_StrFree( vLits );
    }
    ABC_FREE( pBuffer );
    return NULL;
}